

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

char * seconds_to_ddhhmmss_string(char *string_buf,size_t string_buf_len,uint32_t seconds)

{
  int iVar1;
  int secs;
  int minutes;
  int hours;
  int days;
  uint32_t seconds_local;
  size_t string_buf_len_local;
  char *string_buf_local;
  
  iVar1 = ((int)seconds % 0x15180) % 0xe10;
  snprintf(string_buf,string_buf_len,"%02d:%02d:%02d:%02d",(ulong)(uint)((int)seconds / 0x15180),
           (ulong)(uint)(((int)seconds % 0x15180) / 0xe10),(ulong)(uint)(iVar1 / 0x3c),iVar1 % 0x3c)
  ;
  return string_buf;
}

Assistant:

char* seconds_to_ddhhmmss_string(char* string_buf, size_t string_buf_len, uint32_t seconds) {
    int days, hours, minutes, secs;

    secs = seconds;
    days = secs / (3600 * 24);
    secs -= days * (3600 * 24);
    hours = secs / 3600;
    secs -= hours * 3600;
    minutes = secs / 60;
    secs -= minutes * 60;

    snprintf(string_buf, string_buf_len, "%02d:%02d:%02d:%02d", days, hours, minutes, secs);

    return string_buf;
}